

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::StartLayer
          (S2Builder *this,
          unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *layer)

{
  pointer *ppGVar1;
  iterator __position;
  iterator __position_00;
  int iVar2;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (*((layer->_M_t).super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>.
     _M_t.super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
     super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl)->_vptr_Layer[2])(&local_38);
  __position._M_current =
       (this->layer_options_).
       super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->layer_options_).
      super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
    _M_realloc_insert<S2Builder::GraphOptions>
              (&this->layer_options_,__position,(GraphOptions *)&local_38);
  }
  else {
    *(undefined4 *)&(__position._M_current)->allow_vertex_filtering_ = local_28._0_4_;
    *(void **)__position._M_current = local_38._M_unused._M_object;
    (__position._M_current)->duplicate_edges_ = local_38._8_4_;
    (__position._M_current)->sibling_pairs_ = local_38._12_4_;
    ppGVar1 = &(this->layer_options_).
               super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  iVar2 = (int)((ulong)((long)(this->input_edges_).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->input_edges_).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_38._0_4_ = iVar2;
  __position_00._M_current =
       (this->layer_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->layer_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->layer_begins_,__position_00,(int *)local_38._M_pod_data);
  }
  else {
    *__position_00._M_current = iVar2;
    (this->layer_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_S2Builder::Graph_&,_S2Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc:321:10)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_S2Builder::Graph_&,_S2Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc:321:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(S2Builder::Graph_const&,S2Error*)>,std::allocator<std::function<bool(S2Builder::Graph_const&,S2Error*)>>>
  ::emplace_back<std::function<bool(S2Builder::Graph_const&,S2Error*)>>
            ((vector<std::function<bool(S2Builder::Graph_const&,S2Error*)>,std::allocator<std::function<bool(S2Builder::Graph_const&,S2Error*)>>>
              *)&this->layer_is_full_polygon_predicates_,
             (function<bool_(const_S2Builder::Graph_&,_S2Error_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  std::
  vector<std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>,std::allocator<std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>>>
  ::emplace_back<std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>>
            ((vector<std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>,std::allocator<std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>>>
              *)&this->layers_,layer);
  return;
}

Assistant:

void S2Builder::StartLayer(unique_ptr<Layer> layer) {
  layer_options_.push_back(layer->graph_options());
  layer_begins_.push_back(input_edges_.size());
  layer_is_full_polygon_predicates_.push_back(IsFullPolygon(false));
  layers_.push_back(std::move(layer));
}